

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseCodeMetadataAnnotation(WastParser *this,ExprList *exprs)

{
  bool bVar1;
  Token local_120;
  TokenType local_dc;
  undefined1 local_d8 [4];
  TokenType rpar;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_d0;
  allocator<unsigned_char> local_c1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  undefined1 local_b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_90 [8];
  string data_text;
  string_view name;
  Token tk;
  ExprList *exprs_local;
  WastParser *this_local;
  
  Consume((Token *)&name._M_str,this);
  join_0x00000010_0x00000000_ = Token::text((Token *)&name._M_str);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&data_text.field_2 + 8),0xe)
  ;
  std::__cxx11::string::string((string *)local_90);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = ParseQuotedText(this,(string *)local_90,false);
  bVar1 = Failed(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    local_b8._M_current = (char *)std::__cxx11::string::begin();
    local_c0._M_current = (char *)std::__cxx11::string::end();
    std::allocator<unsigned_char>::allocator(&local_c1);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_b0,local_b8,local_c0,
               &local_c1);
    std::allocator<unsigned_char>::~allocator(&local_c1);
    std::
    make_unique<wabt::CodeMetadataExpr,std::basic_string_view<char,std::char_traits<char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((basic_string_view<char,_std::char_traits<char>_> *)local_d8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&data_text.field_2 + 8));
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::CodeMetadataExpr,std::default_delete<wabt::CodeMetadataExpr>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_d0,
               (unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
               local_d8);
    intrusive_list<wabt::Expr>::push_back(exprs,&local_d0);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_d0);
    std::unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_>::
    ~unique_ptr((unique_ptr<wabt::CodeMetadataExpr,_std::default_delete<wabt::CodeMetadataExpr>_> *)
                local_d8);
    local_dc = Peek(this,0);
    if (local_dc != Rpar) {
      __assert_fail("rpar == TokenType::Rpar",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x7a9,"Result wabt::WastParser::ParseCodeMetadataAnnotation(ExprList *)");
    }
    Consume(&local_120,this);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b0);
  }
  std::__cxx11::string::~string((string *)local_90);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseCodeMetadataAnnotation(ExprList* exprs) {
  WABT_TRACE(ParseCodeMetadataAnnotation);
  Token tk = Consume();
  std::string_view name = tk.text();
  name.remove_prefix(sizeof("metadata.code.") - 1);
  std::string data_text;
  CHECK_RESULT(ParseQuotedText(&data_text, false));
  std::vector<uint8_t> data(data_text.begin(), data_text.end());
  exprs->push_back(std::make_unique<CodeMetadataExpr>(name, std::move(data)));
  TokenType rpar = Peek();
  WABT_USE(rpar);
  assert(rpar == TokenType::Rpar);
  Consume();
  return Result::Ok;
}